

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O1

void __thiscall kpeg::MCU::computeIDCT(MCU *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  Level LVar4;
  Logger *pLVar5;
  ostream *poVar6;
  Level lvl;
  Level lvl_00;
  MCU *pMVar7;
  int iVar8;
  int iVar9;
  int v;
  long lVar10;
  int u;
  long lVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float Cu;
  MCU *local_a8;
  string local_90;
  array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *local_70;
  long local_68;
  array<std::array<float,_8UL>,_8UL> *local_60;
  long local_58;
  float *local_50;
  long local_48;
  long local_40;
  double local_38;
  
  pLVar5 = Logger::get();
  LVar4 = Logger::getLevel(pLVar5);
  if (1 < (int)LVar4) {
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(&local_90,(Logger *)0x2,lvl);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"MCU.cpp",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xae);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Performing IDCT on MCU: ",0x18);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,m_MCUCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"...",3);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  local_70 = &this->icoeffs;
  lVar10 = 0;
  local_a8 = this;
  do {
    local_60 = local_70->_M_elems + lVar10;
    iVar8 = 1;
    lVar11 = 0;
    local_68 = lVar10;
    do {
      local_50 = local_60->_M_elems[0]._M_elems + lVar11;
      lVar10 = 0;
      local_58 = lVar11;
      do {
        local_40 = lVar10 * 2 + 1;
        fVar14 = 0.0;
        lVar11 = 0;
        pMVar7 = local_a8;
        local_48 = lVar10;
        do {
          fVar1 = *(float *)(&DAT_00133d30 + (ulong)(lVar11 == 0) * 4);
          local_38 = (double)((int)lVar11 * (int)local_40) * 3.141592653589793 * 0.0625;
          iVar9 = 0;
          lVar10 = 0;
          do {
            iVar3 = (pMVar7->m_8x8block)._M_elems[0]._M_elems[0]._M_elems[lVar10];
            fVar2 = *(float *)(&DAT_00133d30 + (ulong)(lVar10 == 0) * 4);
            dVar12 = cos(local_38);
            dVar13 = cos((double)iVar9 * 3.141592653589793 * 0.0625);
            fVar14 = (float)(dVar13 * dVar12 * (double)((float)iVar3 * fVar2 * fVar1) +
                            (double)fVar14);
            lVar10 = lVar10 + 1;
            iVar9 = iVar9 + iVar8;
          } while (lVar10 != 8);
          lVar11 = lVar11 + 1;
          pMVar7 = (MCU *)((pMVar7->m_8x8block)._M_elems[0]._M_elems + 1);
        } while (lVar11 != 8);
        local_50[local_48 * 8] = fVar14 * 0.25;
        lVar10 = local_48 + 1;
      } while (lVar10 != 8);
      lVar11 = local_58 + 1;
      iVar8 = iVar8 + 2;
    } while (lVar11 != 8);
    lVar10 = local_68 + 1;
    local_a8 = (MCU *)((local_a8->m_8x8block)._M_elems + 1);
  } while (lVar10 != 3);
  pLVar5 = Logger::get();
  LVar4 = Logger::getLevel(pLVar5);
  if (1 < (int)LVar4) {
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(&local_90,(Logger *)0x2,lvl_00);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"MCU.cpp",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"IDCT of MCU: ",0xd);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,m_MCUCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," complete [OK]",0xe);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void MCU::computeIDCT()
    {
        LOG(Logger::Level::DEBUG) << "Performing IDCT on MCU: " << m_MCUCount << "..." << std::endl;
        
        for ( int i = 0; i <3; ++i )
        {
            for ( int y = 0; y < 8; ++y )
            {
                for ( int x = 0; x < 8; ++x )
                {
                    float sum = 0.0;
                    
                    for ( int u = 0; u < 8; ++u )
                    //for ( int v = 0; v < 8; ++v )
                    {
                        for ( int v = 0; v < 8; ++v )
                        //for ( int u = 0; u < 8; ++u )
                        {
                            float Cu = u == 0 ? 1.0 / std::sqrt(2.0) : 1.0;
                            float Cv = v == 0 ? 1.0 / std::sqrt(2.0) : 1.0;
                            
                            sum += Cu * Cv * m_8x8block[i][u][v] * std::cos( ( 2 * x + 1 ) * u * M_PI / 16.0 ) *
                                            std::cos( ( 2 * y + 1 ) * v * M_PI / 16.0 );
                        }
                    }
                    
                    icoeffs[i][x][y] = 0.25 * sum;
                }
            }
        }
        
//         for (auto&& mat: icoeffs )
//         {
//             for ( auto&& row : mat )
//             {
//                 for ( auto&& v : row )
//                     //std::cout << std::roundl( v ) + 128 << "\t";
//                     std::cout << std::roundl( v ) << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;
//         }

        LOG(Logger::Level::DEBUG) << "IDCT of MCU: " << m_MCUCount << " complete [OK]" << std::endl;
    }